

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O1

void __thiscall llvm::yaml::Scanner::removeStaleSimpleKeyCandidates(Scanner *this)

{
  long *plVar1;
  ulong uVar2;
  size_t __n;
  long *__dest;
  Twine local_48;
  
  if ((this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
      super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
      super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.super_SmallVectorBase.
      Size != 0) {
    __dest = (long *)(this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
                     super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
                     super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
                     super_SmallVectorBase.BeginX;
    do {
      if ((*(uint *)((long)__dest + 0xc) == this->Line) && (this->Column <= (int)__dest[1] + 0x400U)
         ) {
        __dest = __dest + 3;
      }
      else {
        if (*(char *)((long)__dest + 0x14) == '\x01') {
          Twine::Twine(&local_48,"Could not find expected : for simple key");
          setError(this,&local_48,*(iterator *)(*__dest + 0x18));
        }
        plVar1 = (long *)(this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
                         super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
                         super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
                         super_SmallVectorBase.BeginX;
        if (__dest < plVar1) {
          __assert_fail("I >= this->begin() && \"Iterator to erase is out of bounds.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                        ,0x1b6,
                        "iterator llvm::SmallVectorImpl<(anonymous namespace)::SimpleKey>::erase(const_iterator) [T = (anonymous namespace)::SimpleKey]"
                       );
        }
        plVar1 = plVar1 + (ulong)(this->SimpleKeys).
                                 super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
                                 super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>
                                 .
                                 super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>
                                 .super_SmallVectorBase.Size * 3;
        if (plVar1 <= __dest) {
          __assert_fail("I < this->end() && \"Erasing at past-the-end iterator.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                        ,0x1b7,
                        "iterator llvm::SmallVectorImpl<(anonymous namespace)::SimpleKey>::erase(const_iterator) [T = (anonymous namespace)::SimpleKey]"
                       );
        }
        __n = (long)plVar1 - (long)(__dest + 3);
        if (__n != 0) {
          memmove(__dest,__dest + 3,__n);
        }
        uVar2 = (ulong)(this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
                       super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
                       super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
                       super_SmallVectorBase.Size - 1;
        if ((this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
            super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
            super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
            super_SmallVectorBase.Capacity < uVar2) {
          __assert_fail("N <= capacity()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                        ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
        }
        (this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
        super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
        super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
        super_SmallVectorBase.Size = (uint)uVar2;
      }
    } while (__dest != (long *)((ulong)(this->SimpleKeys).
                                       super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
                                       super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>
                                       .
                                       super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>
                                       .super_SmallVectorBase.Size * 0x18 +
                               (long)(this->SimpleKeys).
                                     super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
                                     super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>
                                     .
                                     super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>
                                     .super_SmallVectorBase.BeginX));
  }
  return;
}

Assistant:

void Scanner::removeStaleSimpleKeyCandidates() {
  for (SmallVectorImpl<SimpleKey>::iterator i = SimpleKeys.begin();
                                            i != SimpleKeys.end();) {
    if (i->Line != Line || i->Column + 1024 < Column) {
      if (i->IsRequired)
        setError( "Could not find expected : for simple key"
                , i->Tok->Range.begin());
      i = SimpleKeys.erase(i);
    } else
      ++i;
  }
}